

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall Engine_testIncrTagsVector_Test::TestBody(Engine_testIncrTagsVector_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  vector<Tag,_std::allocator<Tag>_> tags;
  Engine e;
  string *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  Measure<int> *in_stack_fffffffffffffc08;
  int line;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  undefined1 uVar4;
  undefined8 in_stack_fffffffffffffc18;
  Type type;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  undefined1 uVar5;
  size_type in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  Message *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined1 uVar6;
  long local_378;
  AssertionResult local_310 [2];
  AssertionResult local_2f0 [2];
  AssertionResult local_2d0 [2];
  AssertionResult local_2b0 [2];
  size_type local_290;
  undefined4 local_284;
  AssertionResult local_280 [2];
  undefined4 local_25c;
  AssertionResult local_258 [2];
  undefined4 local_234;
  AssertionResult local_230 [2];
  undefined4 local_20c;
  AssertionResult local_208 [2];
  AssertionResult local_1e8 [4];
  vector<Tag,_std::allocator<Tag>_> local_1a0;
  uint local_184;
  size_type local_170;
  undefined4 local_164;
  AssertionResult local_160;
  long local_150;
  const_reference local_148;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [88];
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  std::vector<Tag,_std::allocator<Tag>_>::vector((vector<Tag,_std::allocator<Tag>_> *)0x11926e);
  std::vector<Tag,_std::allocator<Tag>_>::reserve
            ((vector<Tag,_std::allocator<Tag>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Foo",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Bar",&local_c1);
  Tag::appendTag((vector<Tag,_std::allocator<Tag>_> *)
                 CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8,(string *)0x119305);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Hello",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"World",&local_111);
  Tag::appendTag((vector<Tag,_std::allocator<Tag>_> *)
                 CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8,(string *)0x1193be);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"foo",&local_139);
  Engine::Incr((Engine *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               (string *)in_stack_fffffffffffffc08,
               (vector<Tag,_std::allocator<Tag>_> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  this_00 = Engine::GetHandlers(&local_40);
  local_148 = std::
              vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  if (pHVar2 == (pointer)0x0) {
    local_378 = 0;
  }
  else {
    local_378 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_150 = local_378;
  local_164 = 1;
  local_170 = std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::size
                        ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_378 + 8));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (int *)in_stack_fffffffffffffbf8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    testing::AssertionResult::failure_message((AssertionResult *)0x11972c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),type,
               (char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x11978f);
  }
  local_184 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1197fd);
  if (local_184 == 0) {
    std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::operator[]
              ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_150 + 8),0);
    Measure<int>::Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc08);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (char (*) [9])in_stack_fffffffffffffbf8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
    uVar6 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      in_stack_fffffffffffffc68 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1198e9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),type,
                 (char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                 (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::Message::~Message((Message *)0x11994c);
    }
    local_184 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1199ba);
    if (local_184 == 0) {
      local_20c = 0;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffc08,
                 (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                 (MetricType *)in_stack_fffffffffffffbf8,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        testing::AssertionResult::failure_message((AssertionResult *)0x119a6c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                   type,(char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
        testing::Message::~Message((Message *)0x119ac9);
      }
      local_184 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x119b37);
      if (local_184 == 0) {
        local_234 = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffc08,
                   (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (int *)in_stack_fffffffffffffbf8,
                   (float *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
          testing::AssertionResult::failure_message((AssertionResult *)0x119be9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                     type,(char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
          testing::Message::~Message((Message *)0x119c46);
        }
        local_184 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x119cb4);
        if (local_184 == 0) {
          local_25c = 1;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)in_stack_fffffffffffffc08,
                     (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                     (int *)in_stack_fffffffffffffbf8,
                     (int *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
            testing::AssertionResult::failure_message((AssertionResult *)0x119d66);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20)
                       ,type,(char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc68);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                      );
            testing::Message::~Message((Message *)0x119dc3);
          }
          local_184 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x119e31);
          if (local_184 == 0) {
            local_284 = 2;
            local_290 = std::vector<Tag,_std::allocator<Tag>_>::size(&local_1a0);
            testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffc08,
                       (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                       (int *)in_stack_fffffffffffffbf8,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
              testing::AssertionResult::failure_message((AssertionResult *)0x119ef8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),type,
                         (char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                         (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                         in_stack_fffffffffffffc68);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
              testing::Message::~Message((Message *)0x119f55);
            }
            local_184 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x119fc3);
            if (local_184 == 0) {
              std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a0,0);
              testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                        ((char *)in_stack_fffffffffffffc08,
                         (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                         (char (*) [4])in_stack_fffffffffffffbf8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
              uVar5 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffc20));
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x11a075);
                type = (Type)((ulong)pcVar3 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc20),type,
                           (char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                           in_stack_fffffffffffffc68);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                testing::Message::~Message((Message *)0x11a0d2);
              }
              local_184 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a140);
              if (local_184 == 0) {
                std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a0,0);
                testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                          ((char *)in_stack_fffffffffffffc08,
                           (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                           (char (*) [4])in_stack_fffffffffffffbf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
                uVar4 = bVar1;
                if (!bVar1) {
                  testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc20));
                  in_stack_fffffffffffffc08 =
                       (Measure<int> *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x11a1f6);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc20),type,
                             (char *)CONCAT17(uVar4,in_stack_fffffffffffffc10),
                             (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                             in_stack_fffffffffffffc68);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                  testing::Message::~Message((Message *)0x11a253);
                }
                local_184 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a2c1);
                if (local_184 == 0) {
                  std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a0,1);
                  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                            ((char *)in_stack_fffffffffffffc08,
                             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                             (char (*) [6])in_stack_fffffffffffffbf8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
                  in_stack_fffffffffffffc07 = bVar1;
                  if (!bVar1) {
                    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc20));
                    in_stack_fffffffffffffbf8 =
                         (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                         testing::AssertionResult::failure_message((AssertionResult *)0x11a374);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc20),type,
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc10),
                               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                              );
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                               in_stack_fffffffffffffc68);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                    testing::Message::~Message((Message *)0x11a3d1);
                  }
                  local_184 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a43f);
                  if (local_184 == 0) {
                    std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a0,1);
                    testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                              ((char *)in_stack_fffffffffffffc08,
                               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                               ,(char (*) [6])in_stack_fffffffffffffbf8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                    line = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
                    in_stack_fffffffffffffbf7 = bVar1;
                    if (!bVar1) {
                      testing::Message::Message
                                ((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc20));
                      testing::AssertionResult::failure_message((AssertionResult *)0x11a4f6);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc20),type,
                                 (char *)CONCAT17(uVar4,in_stack_fffffffffffffc10),line,
                                 (char *)CONCAT17(in_stack_fffffffffffffc07,
                                                  in_stack_fffffffffffffc00));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),
                                 in_stack_fffffffffffffc68);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                      testing::Message::~Message((Message *)0x11a551);
                    }
                    local_184 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a5bc);
                    if (local_184 == 0) {
                      local_184 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Measure<int>::~Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  }
  std::vector<Tag,_std::allocator<Tag>_>::~vector
            ((vector<Tag,_std::allocator<Tag>_> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  return;
}

Assistant:

TEST(Engine, testIncrTagsVector) {
    Engine e("test", std::make_unique<TestHandler>());
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Foo", "Bar");
    Tag::appendTag(tags, "Hello", "World");

    e.Incr("foo", tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(1, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}